

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O3

TestInstance * __thiscall
vkt::image::anon_unknown_0::MemoryQualifierTestCase::createInstance
          (MemoryQualifierTestCase *this,Context *context)

{
  string *name;
  ImageType imageType;
  MemoryQualifierInstanceBase *this_00;
  MemoryQualifierInstanceBase *pMVar1;
  
  imageType = this->m_imageType;
  name = &(this->super_TestCase).super_TestCase.super_TestNode.m_name;
  if (imageType == IMAGE_TYPE_BUFFER) {
    this_00 = (MemoryQualifierInstanceBase *)operator_new(0xd8);
    MemoryQualifierInstanceBase::MemoryQualifierInstanceBase
              (this_00,context,name,IMAGE_TYPE_BUFFER,&this->m_imageSize,&this->m_format);
    (this_00->super_TestInstance)._vptr_TestInstance =
         (_func_int **)&PTR__MemoryQualifierInstanceBuffer_00d33aa8;
    pMVar1 = this_00 + 1;
  }
  else {
    this_00 = (MemoryQualifierInstanceBase *)operator_new(0xe8);
    MemoryQualifierInstanceBase::MemoryQualifierInstanceBase
              (this_00,context,name,imageType,&this->m_imageSize,&this->m_format);
    (this_00->super_TestInstance)._vptr_TestInstance =
         (_func_int **)&PTR__MemoryQualifierInstanceImage_00d33b68;
    this_00[1].super_TestInstance._vptr_TestInstance = (_func_int **)0x0;
    pMVar1 = (MemoryQualifierInstanceBase *)&this_00[1].m_name;
  }
  (pMVar1->m_name)._M_dataplus._M_p = (pointer)0x0;
  (pMVar1->m_name)._M_string_length = 0;
  (pMVar1->super_TestInstance)._vptr_TestInstance = (_func_int **)0x0;
  (pMVar1->super_TestInstance).m_context = (Context *)0x0;
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* MemoryQualifierTestCase::createInstance (Context& context) const
{
	if ( m_imageType == IMAGE_TYPE_BUFFER )
		return new MemoryQualifierInstanceBuffer(context, m_name, m_imageType, m_imageSize, m_format);
	else
		return new MemoryQualifierInstanceImage(context, m_name, m_imageType, m_imageSize, m_format);
}